

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_html_any(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,MD_OFFSET max_end,
                  MD_OFFSET *p_end)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  MD_LINE *unaff_retaddr;
  MD_CTX *in_stack_00000008;
  undefined1 local_29;
  MD_OFFSET max_end_00;
  
  max_end_00 = (MD_OFFSET)((ulong)in_RSI >> 0x20);
  iVar1 = md_is_html_tag(in_stack_00000008,unaff_retaddr,(MD_SIZE)((ulong)in_RDI >> 0x20),
                         (MD_OFFSET)in_RDI,max_end_00,(MD_OFFSET *)CONCAT44(in_EDX,in_ECX));
  local_29 = true;
  if (iVar1 == 0) {
    iVar1 = md_is_html_comment(in_stack_00000008,unaff_retaddr,(MD_SIZE)((ulong)in_RDI >> 0x20),
                               (MD_OFFSET)in_RDI,max_end_00,(MD_OFFSET *)CONCAT44(in_EDX,in_ECX));
    local_29 = true;
    if (iVar1 == 0) {
      iVar1 = md_is_html_processing_instruction
                        (in_stack_00000008,unaff_retaddr,(MD_SIZE)((ulong)in_RDI >> 0x20),
                         (MD_OFFSET)in_RDI,max_end_00,(MD_OFFSET *)CONCAT44(in_EDX,in_ECX));
      local_29 = true;
      if (iVar1 == 0) {
        iVar1 = md_is_html_declaration
                          (in_stack_00000008,unaff_retaddr,(MD_SIZE)((ulong)in_RDI >> 0x20),
                           (MD_OFFSET)in_RDI,max_end_00,(MD_OFFSET *)CONCAT44(in_EDX,in_ECX));
        local_29 = true;
        if (iVar1 == 0) {
          iVar1 = md_is_html_cdata(in_stack_00000008,unaff_retaddr,(MD_SIZE)((ulong)in_RDI >> 0x20),
                                   (MD_OFFSET)in_RDI,max_end_00,(MD_OFFSET *)CONCAT44(in_EDX,in_ECX)
                                  );
          local_29 = iVar1 != 0;
        }
      }
    }
  }
  return (int)local_29;
}

Assistant:

static int
md_is_html_any(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, OFF beg, OFF max_end, OFF* p_end)
{
    MD_ASSERT(CH(beg) == _T('<'));
    return (md_is_html_tag(ctx, lines, n_lines, beg, max_end, p_end)  ||
            md_is_html_comment(ctx, lines, n_lines, beg, max_end, p_end)  ||
            md_is_html_processing_instruction(ctx, lines, n_lines, beg, max_end, p_end)  ||
            md_is_html_declaration(ctx, lines, n_lines, beg, max_end, p_end)  ||
            md_is_html_cdata(ctx, lines, n_lines, beg, max_end, p_end));
}